

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  CubeFace face;
  deUint32 value;
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  int *piVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  Vector<int,_3> (*arr) [5];
  int (*arr_00) [5];
  byte local_749;
  Vector<int,_3> *local_730;
  string local_6f8;
  string local_6d8;
  Vector<int,_2> local_6b8;
  MessageBuilder local_6b0;
  MessageBuilder local_530;
  MessageBuilder local_3b0;
  int local_230;
  bool local_229;
  int i_1;
  bool matchFound;
  IVec3 gid;
  int i;
  int assignArgs [5];
  undefined1 local_1f8 [8];
  IVec3 invocationGlobalIDs [5];
  int local_1a8;
  int local_1a4;
  int result;
  int x;
  int y;
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  LogImage local_c0;
  int local_2c;
  ConstPixelBufferAccess *pCStack_28;
  int sliceOrFaceNdx_local;
  ConstPixelBufferAccess *resultSlice_local;
  TestLog *log_local;
  EndResultVerifier *this_local;
  
  local_2c = sliceOrFaceNdx;
  pCStack_28 = resultSlice;
  resultSlice_local = (ConstPixelBufferAccess *)log;
  log_local = (TestLog *)this;
  de::toString<int>(&local_100,&local_2c);
  std::operator+(&local_e0,"EndResults",&local_100);
  local_172 = 0;
  local_173 = 0;
  x._3_1_ = 0;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    face = glslImageFuncZToCubeFace(local_2c);
    value = cubeFaceToGLFace(face);
    __s = glu::getCubeMapFaceName(value);
    std::allocator<char>::allocator();
    local_172 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,__s,&local_171);
    local_173 = 1;
    std::operator+(&local_150,"face ",&local_170);
  }
  else {
    de::toString<int>((string *)&y,&local_2c);
    x._3_1_ = 1;
    std::operator+(&local_150,"slice ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y);
  }
  std::operator+(&local_130,"Result Values, ",&local_150);
  tcu::LogImage::LogImage(&local_c0,&local_e0,&local_130,pCStack_28,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(log,&local_c0);
  tcu::LogImage::~LogImage(&local_c0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  if ((x._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&y);
  }
  if ((local_173 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_170);
  }
  if ((local_172 & 1) != 0) {
    std::allocator<char>::~allocator(&local_171);
  }
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  result = 0;
  do {
    iVar3 = result;
    iVar1 = tcu::ConstPixelBufferAccess::getHeight(pCStack_28);
    if (iVar1 <= iVar3) {
      return true;
    }
    for (local_1a4 = 0; iVar3 = local_1a4, iVar1 = tcu::ConstPixelBufferAccess::getWidth(pCStack_28)
        , iVar3 < iVar1; local_1a4 = local_1a4 + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)(invocationGlobalIDs[4].m_data + 2),(int)pCStack_28,
                 local_1a4,result);
      piVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)(invocationGlobalIDs[4].m_data + 2));
      local_1a8 = *piVar4;
      local_730 = (Vector<int,_3> *)local_1f8;
      do {
        tcu::Vector<int,_3>::Vector(local_730);
        local_730 = local_730 + 1;
      } while (local_730 != (Vector<int,_3> *)(invocationGlobalIDs[4].m_data + 1));
      for (gid.m_data[1] = 0; iVar1 = local_1a4, iVar3 = gid.m_data[1], gid.m_data[1] < 5;
          gid.m_data[1] = gid.m_data[1] + 1) {
        iVar2 = tcu::ConstPixelBufferAccess::getWidth(pCStack_28);
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&i_1,iVar1 + iVar3 * iVar2,result,local_2c);
        *(undefined8 *)(invocationGlobalIDs[(long)gid.m_data[1] + -1].m_data + 1) = _i_1;
        invocationGlobalIDs[gid.m_data[1]].m_data[0] = gid.m_data[0];
        iVar3 = getAssignArg((IVec3 *)&i_1,this->m_imageWidth);
        gid.m_data[(long)gid.m_data[1] + 2] = iVar3;
      }
      local_229 = false;
      local_230 = 0;
      while( true ) {
        local_749 = 0;
        if (local_230 < 5) {
          local_749 = local_229 ^ 0xff;
        }
        if ((local_749 & 1) == 0) break;
        local_229 = local_1a8 == gid.m_data[(long)local_230 + 2];
        local_230 = local_230 + 1;
      }
      if (local_229 == false) {
        tcu::TestLog::operator<<
                  (&local_6b0,(TestLog *)resultSlice_local,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_6b0,(char (*) [36])"// Failure: invalid value at pixel ");
        tcu::Vector<int,_2>::Vector(&local_6b8,local_1a4,result);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6b8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2bc0853);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xfffffffffffffe58);
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_530,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_530,
                            (char (*) [52])"// Note: relevant shader invocation global IDs are ");
        arrayStr<tcu::Vector<int,3>,5>(&local_6d8,(Functional *)local_1f8,arr);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6d8);
        pTVar6 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_3b0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_3b0,(char (*) [26])"// Note: expected one of ");
        arrayStr<int,5>(&local_6f8,(Functional *)(gid.m_data + 2),arr_00);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_6f8);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [102])
                                   " (those are the values given as the \'data\' argument in the invocations that contribute to this pixel)"
                           );
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_6f8);
        tcu::MessageBuilder::~MessageBuilder(&local_3b0);
        std::__cxx11::string::~string((string *)&local_6d8);
        tcu::MessageBuilder::~MessageBuilder(&local_530);
        tcu::MessageBuilder::~MessageBuilder(&local_6b0);
        return false;
      }
    }
    result = result + 1;
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == m_imageWidth);

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			// Compute the value-to-assign arguments that were given to the atomic function in the invocations that contribute to this pixel.
			// One of those should be the result.

			const int	result = resultSlice.getPixelInt(x, y).x();
			IVec3		invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int			assignArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				assignArgs[i]			= getAssignArg(gid, m_imageWidth);
			}

			{
				bool matchFound = false;
				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = result == assignArgs[i];

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << result << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected one of " << arrayStr(assignArgs)
											<< " (those are the values given as the 'data' argument in the invocations that contribute to this pixel)"
											<< TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}